

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cipher.c
# Opt level: O3

void mbedtls_cipher_free(mbedtls_cipher_context_t *ctx)

{
  long lVar1;
  
  if (ctx != (mbedtls_cipher_context_t *)0x0) {
    if (ctx->cipher_ctx != (void *)0x0) {
      (*ctx->cipher_info->base->ctx_free_func)(ctx->cipher_ctx);
    }
    lVar1 = 0;
    do {
      ctx->unprocessed_data[lVar1 + -0x20] = '\0';
      lVar1 = lVar1 + 1;
    } while (lVar1 != 0x58);
  }
  return;
}

Assistant:

void mbedtls_cipher_free( mbedtls_cipher_context_t *ctx )
{
    if( ctx == NULL )
        return;

#if defined(MBEDTLS_CMAC_C)
    if( ctx->cmac_ctx )
    {
       mbedtls_zeroize( ctx->cmac_ctx, sizeof( mbedtls_cmac_context_t ) );
       mbedtls_free( ctx->cmac_ctx );
    }
#endif

    if( ctx->cipher_ctx )
        ctx->cipher_info->base->ctx_free_func( ctx->cipher_ctx );

    mbedtls_zeroize( ctx, sizeof(mbedtls_cipher_context_t) );
}